

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O3

void KokkosTools::KernelTimer::kokkosp_pop_profile_region(void)

{
  uint uVar1;
  char *pcVar2;
  int i;
  long lVar3;
  
  uVar1 = current_region_level - 1;
  if (0 < (int)current_region_level) {
    current_region_level = uVar1;
    KernelPerformanceInfo::addFromTimer((KernelPerformanceInfo *)(&regions)[uVar1]);
    return;
  }
  current_region_level = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"WARNING:: Kokkos::Profiling::popRegion() called outside ",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," of an actve region. Previous regions: ",0x27);
  lVar3 = 0;
  do {
    if ((&regions)[lVar3] == 0) break;
    pcVar2 = ";";
    if (lVar3 == 0) {
      pcVar2 = " ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,*(char **)(&regions)[lVar3],
               ((undefined8 *)(&regions)[lVar3])[1]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  return;
}

Assistant:

void kokkosp_pop_profile_region() {
  current_region_level--;

  // current_region_level is out of bounds, inform the user they
  // called popRegion too many times.
  if (current_region_level < 0) {
    current_region_level = 0;
    std::cerr << "WARNING:: Kokkos::Profiling::popRegion() called outside "
              << " of an actve region. Previous regions: ";

    /* This code block will walk back through the non-null regions
     * pointers and print the names.  This takes advantage of a slight
     * issue with regions logic: we never actually delete the
     * KernelPerformanceInfo objects.  If that ever changes this needs
     * to be updated.
     */
    for (int i = 0; i < 5; i++) {
      if (regions[i] != 0) {
        std::cerr << (i == 0 ? " " : ";") << regions[i]->getName();
      } else {
        break;
      }
    }
    std::cerr << "\n";
  } else {
    // don't call addFromTimer if we are outside an active region
    regions[current_region_level]->addFromTimer();
  }
}